

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

FString V_GetColorStringByName(char *name)

{
  int iVar1;
  DWORD *pDVar2;
  DWORD *pDVar3;
  ulong uVar4;
  FString in_RSI;
  bool bVar5;
  size_t checklen;
  uint local_68;
  size_t local_58;
  size_t namelen;
  uint local_48;
  int step;
  int c [3];
  int rgblump;
  char *endp;
  char *rgb;
  char *rgbEnd;
  FMemLump rgbNames;
  char *name_local;
  FString *descr;
  
  rgbNames.Block.Chars = (FString)(FString)in_RSI.Chars;
  FMemLump::FMemLump((FMemLump *)&rgbEnd);
  iVar1 = FWadCollection::GetNumLumps(&Wads);
  if (iVar1 == 0) {
    FString::FString((FString *)name);
  }
  else {
    c[1] = FWadCollection::CheckNumForName(&Wads,"X11R6RGB");
    if (c[1] == -1) {
      Printf("X11R6RGB lump not found\n");
      FString::FString((FString *)name);
    }
    else {
      FWadCollection::ReadLump((FWadCollection *)&checklen,0xdb0460);
      FMemLump::operator=((FMemLump *)&rgbEnd,(FMemLump *)&checklen);
      FMemLump::~FMemLump((FMemLump *)&checklen);
      pDVar2 = (DWORD *)FMemLump::GetMem((FMemLump *)&rgbEnd);
      iVar1 = FWadCollection::LumpLength(&Wads,c[1]);
      pDVar3 = (DWORD *)((long)pDVar2 + (long)iVar1);
      namelen._4_4_ = 0;
      local_58 = strlen((char *)rgbNames.Block.Chars);
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              endp = (char *)pDVar2;
              if (pDVar3 <= endp) goto LAB_00739832;
              if (' ' < *endp) break;
              do {
                endp = endp + 1;
                bVar5 = false;
                if (endp < pDVar3) {
                  bVar5 = (char)*(DWORD *)endp < '!';
                }
                pDVar2 = (DWORD *)endp;
              } while (bVar5);
            }
            if ((namelen._4_4_ != 0) || (*endp != '!')) break;
            do {
              endp = endp + 1;
              bVar5 = false;
              if (endp < pDVar3) {
                bVar5 = (char)*(DWORD *)endp != '\n';
              }
              pDVar2 = (DWORD *)endp;
            } while (bVar5);
          }
          if (namelen._4_4_ < 3) break;
          stack0xffffffffffffffc8 = (DWORD *)endp;
          while( true ) {
            bVar5 = false;
            if (stack0xffffffffffffffc8 < pDVar3) {
              bVar5 = (char)*stack0xffffffffffffffc8 != '\n';
            }
            if (!bVar5) break;
            register0x00000000 = (DWORD *)((long)stack0xffffffffffffffc8 + 1);
          }
          while( true ) {
            bVar5 = false;
            if (endp < stack0xffffffffffffffc8) {
              bVar5 = (char)*stack0xffffffffffffffc8 < '!';
            }
            if (!bVar5) break;
            register0x00000000 = (DWORD *)((long)stack0xffffffffffffffc8 + -1);
          }
          if (stack0xffffffffffffffc8 == (DWORD *)endp) goto LAB_00739832;
          register0x00000000 = (DWORD *)((long)stack0xffffffffffffffc8 + 1);
          if (((long)register0x00000000 - (long)endp == local_58) &&
             (iVar1 = strncasecmp(endp,(char *)rgbNames.Block.Chars,
                                  (long)register0x00000000 - (long)endp), iVar1 == 0)) {
            FString::FString((FString *)name);
            FString::Format((FString *)name,"#%02x%02x%02x",(ulong)local_48,(ulong)(uint)step,
                            (ulong)(uint)c[0]);
            goto LAB_00739863;
          }
          namelen._4_4_ = 0;
          pDVar2 = stack0xffffffffffffffc8;
        }
        uVar4 = strtoul(endp,(char **)(c + 2),10);
        iVar1 = namelen._4_4_ + 1;
        (&local_48)[namelen._4_4_] = (uint)uVar4;
        namelen._4_4_ = iVar1;
        pDVar2 = stack0xffffffffffffffc8;
      } while (stack0xffffffffffffffc8 != (DWORD *)endp);
LAB_00739832:
      if (endp < pDVar3) {
        Printf("X11R6RGB lump is corrupt\n");
      }
      FString::FString((FString *)name);
    }
  }
LAB_00739863:
  local_68 = 1;
  FMemLump::~FMemLump((FMemLump *)&rgbEnd);
  return (FString)name;
}

Assistant:

FString V_GetColorStringByName (const char *name)
{
	FMemLump rgbNames;
	char *rgbEnd;
	char *rgb, *endp;
	int rgblump;
	int c[3], step;
	size_t namelen;

	if (Wads.GetNumLumps()==0) return FString();

	rgblump = Wads.CheckNumForName ("X11R6RGB");
	if (rgblump == -1)
	{
		Printf ("X11R6RGB lump not found\n");
		return FString();
	}

	rgbNames = Wads.ReadLump (rgblump);
	rgb = (char *)rgbNames.GetMem();
	rgbEnd = rgb + Wads.LumpLength (rgblump);
	step = 0;
	namelen = strlen (name);

	while (rgb < rgbEnd)
	{
		// Skip white space
		if (*rgb <= ' ')
		{
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb <= ' ');
		}
		else if (step == 0 && *rgb == '!')
		{ // skip comment lines
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb != '\n');
		}
		else if (step < 3)
		{ // collect RGB values
			c[step++] = strtoul (rgb, &endp, 10);
			if (endp == rgb)
			{
				break;
			}
			rgb = endp;
		}
		else
		{ // Check color name
			endp = rgb;
			// Find the end of the line
			while (endp < rgbEnd && *endp != '\n')
				endp++;
			// Back up over any whitespace
			while (endp > rgb && *endp <= ' ')
				endp--;
			if (endp == rgb)
			{
				break;
			}
			size_t checklen = ++endp - rgb;
			if (checklen == namelen && strnicmp (rgb, name, checklen) == 0)
			{
				FString descr;
				descr.Format ("#%02x%02x%02x", c[0], c[1], c[2]);
				return descr;
			}
			rgb = endp;
			step = 0;
		}
	}
	if (rgb < rgbEnd)
	{
		Printf ("X11R6RGB lump is corrupt\n");
	}
	return FString();
}